

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O0

void __thiscall Sinclair::ZXSpectrum::Video::State::State(State *this)

{
  bool bVar1;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  State *local_10;
  State *this_local;
  
  local_10 = this;
  Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::StructImpl
            (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>);
  (this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00cab058;
  this->border_colour = '\0';
  this->half_cycles_since_interrupt = 0;
  this->flash = false;
  this->flash_counter = 0;
  this->is_alternate_line = false;
  bVar1 = Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::needs_declare
                    (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"border_colour",&local_41);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<unsigned_char>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->border_colour,
               &local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"half_cycles_since_interrupt",&local_69);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<int>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,
               &this->half_cycles_since_interrupt,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"flash",&local_91);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<bool>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->flash,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"flash_counter",&local_b9);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<int>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->flash_counter,
               &local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"is_alternate_line",&local_e1);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<bool>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->is_alternate_line,
               &local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  return;
}

Assistant:

State() {
		if(needs_declare()) {
			DeclareField(border_colour);
			DeclareField(half_cycles_since_interrupt);
			DeclareField(flash);
			DeclareField(flash_counter);
			DeclareField(is_alternate_line);
		}
	}